

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O2

int __thiscall Fl_Valuator::format(Fl_Valuator *this,char *buffer)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  char temp [32];
  
  dVar1 = this->value_;
  dVar2 = this->A;
  if (((dVar2 == 0.0) && (!NAN(dVar2))) || (this->B == 0)) {
    iVar4 = snprintf(buffer,0x80,"%g",dVar1);
    return iVar4;
  }
  snprintf(temp,0x20,"%.12f",dVar2 / (double)this->B);
  sVar5 = strlen(temp);
  uVar6 = sVar5 & 0xffffffff;
  do {
    uVar3 = (uint)uVar6;
    if ((int)uVar3 < 2) break;
    uVar6 = uVar6 - 1;
  } while (temp[uVar6 & 0xffffffff] == '0');
  uVar6 = 0;
  while ((uVar3 = uVar3 - 1, 0 < (int)uVar3 && ((int)temp[uVar3] - 0x30U < 10))) {
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  iVar4 = snprintf(buffer,0x80,"%.*f",dVar1,uVar6);
  return iVar4;
}

Assistant:

int Fl_Valuator::format(char* buffer) {
  double v = value();
  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  if (!A || !B) return snprintf(buffer, 128, "%g", v);

  // Figure out how many digits are required to correctly format the
  // value.
  int i, c = 0;
  char temp[32];
  // output a number with many digits after the decimal point. This
  // seems to be needed to get high precission
  snprintf(temp, sizeof(temp), "%.12f", A/B);
  // strip all trailing 0's
  for (i=(int) strlen(temp)-1; i>0; i--) {
    if (temp[i]!='0') break;
  }
  // count digits until we find the decimal point (or comma or whatever
  // letter is set in the current locale)
  for (; i>0; i--, c++) {
    if (!isdigit(temp[i])) break;
  }

  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  return snprintf(buffer, 128, "%.*f", c, v);
}